

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operats.c
# Opt level: O3

Vector * MulAsgn_VS(Vector *V,double S)

{
  ulong uVar1;
  Real *pRVar2;
  LASErrIdType LVar3;
  char *Object1Name;
  ulong uVar4;
  Vector *pVVar5;
  
  V_Lock(V);
  LVar3 = LASResult();
  if (LVar3 == LASOK) {
    if (V->Instance == Normal) {
      uVar1 = V->Dim;
      pVVar5 = V;
      if (uVar1 != 0) {
        pRVar2 = V->Cmp;
        uVar4 = 1;
        do {
          pRVar2[uVar4] = pRVar2[uVar4] * S;
          uVar4 = uVar4 + 1;
        } while (uVar4 <= uVar1);
      }
    }
    else {
      Object1Name = V_GetName(V);
      LASError(LASLValErr,"MulAsgn_VS",Object1Name,(char *)0x0,(char *)0x0);
      pVVar5 = (Vector *)0x0;
    }
  }
  else {
    pVVar5 = (Vector *)0x0;
  }
  V_Unlock(V);
  return pVVar5;
}

Assistant:

Vector *MulAsgn_VS(Vector *V, double S)
/* VRes = V *= S */
{
    Vector *VRes;

    size_t Dim, Ind;
    Real *VCmp;

    V_Lock(V);
    
    if (LASResult() == LASOK) {
        if (V->Instance == Normal) {
            Dim = V->Dim;
            VCmp = V->Cmp;
            for_AllCmp
                VCmp[Ind] *= S;
            VRes = V;
        } else {
            LASError(LASLValErr, "MulAsgn_VS", V_GetName(V), NULL, NULL);
            VRes = NULL;
        }
    } else {
        VRes = NULL;
    }

    V_Unlock(V);

    return(VRes);
}